

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O3

int Sfm_NtkCollectTfi_rec(Sfm_Ntk_t *p,int iNode,Vec_Int_t *vNodes)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  long lVar4;
  
  if ((iNode < 0) || ((p->vTravIds).nSize <= iNode)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar1 = (p->vTravIds).pArray;
  if (piVar1[(uint)iNode] == p->nTravIds) {
    return 0;
  }
  piVar1[(uint)iNode] = p->nTravIds;
  if (iNode < (p->vFanins).nSize) {
    lVar4 = 0;
    do {
      pVVar2 = (p->vFanins).pArray;
      if (pVVar2[(uint)iNode].nSize <= lVar4) {
        Vec_IntPush(vNodes,iNode);
        iVar3 = p->pPars->nWinSizeMax;
        if (iVar3 == 0) {
          return 0;
        }
        return (uint)(iVar3 < vNodes->nSize);
      }
      iVar3 = Sfm_NtkCollectTfi_rec(p,pVVar2[(uint)iNode].pArray[lVar4],vNodes);
      if (iVar3 != 0) {
        return 1;
      }
      lVar4 = lVar4 + 1;
    } while (iNode < (p->vFanins).nSize);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Sfm_NtkCollectTfi_rec( Sfm_Ntk_t * p, int iNode, Vec_Int_t * vNodes )
{
    int i, iFanin;
    if ( Sfm_ObjIsTravIdCurrent( p, iNode ) )
        return 0;
    Sfm_ObjSetTravIdCurrent( p, iNode );
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
        if ( Sfm_NtkCollectTfi_rec( p, iFanin, vNodes ) )
            return 1;
    Vec_IntPush( vNodes, iNode );
    return p->pPars->nWinSizeMax && (Vec_IntSize(vNodes) > p->pPars->nWinSizeMax);
}